

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_node(lyd_lyb_ctx *lybctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  lyd_node *lybctx_00;
  lysc_node *sparent;
  char local_5b [8];
  char mod_rev [11];
  char *mod_name;
  lys_module *plStack_40;
  lylyb_node_type lyb_type;
  lys_module *mod;
  lysc_node *snode;
  ly_set *plStack_28;
  LY_ERR ret;
  ly_set *parsed_local;
  lyd_node **first_p_local;
  lyd_node *parent_local;
  lyd_lyb_ctx *lybctx_local;
  
  mod_rev[3] = '\0';
  mod_rev[4] = '\0';
  mod_rev[5] = '\0';
  mod_rev[6] = '\0';
  mod_rev[7] = '\0';
  mod_rev[8] = '\0';
  mod_rev[9] = '\0';
  mod_rev[10] = '\0';
  plStack_28 = parsed;
  parsed_local = (ly_set *)first_p;
  first_p_local = (lyd_node **)parent;
  parent_local = (lyd_node *)lybctx;
  lyb_read_number((void *)((long)&mod_name + 4),4,1,lybctx->lybctx);
  lybctx_00 = parent_local;
  if (mod_name._4_4_ == 0) {
    snode._4_4_ = lyb_parse_model((lylyb_ctx *)parent_local[0x4b].parent,
                                  *(uint32_t *)&parent_local->schema,'\0',&stack0xffffffffffffffc0);
    if ((snode._4_4_ != LY_SUCCESS) ||
       (snode._4_4_ = lyb_parse_schema_hash
                                ((lyd_lyb_ctx *)parent_local,(lysc_node *)0x0,plStack_40,
                                 (lysc_node **)&mod), snode._4_4_ != LY_SUCCESS)) goto LAB_00154131;
    snode._4_4_ = 0;
  }
  else if (mod_name._4_4_ - 1U < 2) {
    sparent = lyd_parser_node_schema((lyd_node *)first_p_local);
    snode._4_4_ = lyb_parse_schema_hash
                            ((lyd_lyb_ctx *)lybctx_00,sparent,(lys_module *)0x0,(lysc_node **)&mod);
    if (snode._4_4_ != LY_SUCCESS) goto LAB_00154131;
    snode._4_4_ = 0;
  }
  else if (mod_name._4_4_ == 3) {
    snode._4_4_ = lyb_read_model((lylyb_ctx *)parent_local[0x4b].parent,(char **)(mod_rev + 3),
                                 local_5b,(ly_set *)0x0);
    if ((snode._4_4_ != LY_SUCCESS) ||
       (snode._4_4_ = lyb_parse_schema_nested_ext
                                ((lyd_lyb_ctx *)parent_local,(lyd_node *)first_p_local,
                                 (char *)mod_rev._3_8_,(lysc_node **)&mod),
       snode._4_4_ != LY_SUCCESS)) goto LAB_00154131;
    snode._4_4_ = 0;
  }
  if (mod == (lys_module *)0x0) {
    snode._4_4_ = lyb_parse_node_opaq((lyd_lyb_ctx *)parent_local,(lyd_node *)first_p_local,
                                      (lyd_node **)parsed_local,plStack_28);
  }
  else if (((ulong)mod->ctx & 8) == 0) {
    if (*(short *)&mod->ctx == 0x10) {
      snode._4_4_ = lyb_parse_node_list((lyd_lyb_ctx *)parent_local,(lyd_node *)first_p_local,
                                        (lysc_node *)mod,(lyd_node **)parsed_local,plStack_28);
    }
    else if (((ulong)mod->ctx & 0x60) == 0) {
      if (((ulong)mod->ctx & 0x711) == 0) {
        snode._4_4_ = lyb_parse_node_leaf((lyd_lyb_ctx *)parent_local,(lyd_node *)first_p_local,
                                          (lysc_node *)mod,(lyd_node **)parsed_local,plStack_28);
      }
      else {
        snode._4_4_ = lyb_parse_node_inner
                                ((lyd_lyb_ctx *)parent_local,(lyd_node *)first_p_local,
                                 (lysc_node *)mod,(lyd_node **)parsed_local,plStack_28);
      }
    }
    else {
      snode._4_4_ = lyb_parse_node_any((lyd_lyb_ctx *)parent_local,(lyd_node *)first_p_local,
                                       (lysc_node *)mod,(lyd_node **)parsed_local,plStack_28);
    }
  }
  else {
    snode._4_4_ = lyb_parse_node_leaflist
                            ((lyd_lyb_ctx *)parent_local,(lyd_node *)first_p_local,(lysc_node *)mod,
                             (lyd_node **)parsed_local,plStack_28);
  }
LAB_00154131:
  free((void *)mod_rev._3_8_);
  return snode._4_4_;
}

Assistant:

static LY_ERR
lyb_parse_node(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, struct lyd_node **first_p,
        struct ly_set *parsed)
{
    LY_ERR ret;
    const struct lysc_node *snode;
    const struct lys_module *mod;
    enum lylyb_node_type lyb_type;
    char *mod_name = NULL, mod_rev[LY_REV_SIZE];

    /* read node type */
    lyb_read_number(&lyb_type, sizeof lyb_type, 1, lybctx->lybctx);

    switch (lyb_type) {
    case LYB_NODE_TOP:
        /* top-level, read module name */
        LY_CHECK_GOTO(ret = lyb_parse_model(lybctx->lybctx, lybctx->parse_opts, 0, &mod), cleanup);

        /* read hash, find the schema node starting from mod */
        LY_CHECK_GOTO(ret = lyb_parse_schema_hash(lybctx, NULL, mod, &snode), cleanup);
        break;
    case LYB_NODE_CHILD:
    case LYB_NODE_OPAQ:
        /* read hash, find the schema node starting from parent schema, if any */
        LY_CHECK_GOTO(ret = lyb_parse_schema_hash(lybctx, lyd_parser_node_schema(parent), NULL, &snode), cleanup);
        break;
    case LYB_NODE_EXT:
        /* ext, read module name */
        LY_CHECK_GOTO(ret = lyb_read_model(lybctx->lybctx, &mod_name, mod_rev, NULL), cleanup);

        /* read schema node name, find the nexted ext schema node */
        LY_CHECK_GOTO(ret = lyb_parse_schema_nested_ext(lybctx, parent, mod_name, &snode), cleanup);
        break;
    }

    if (!snode) {
        ret = lyb_parse_node_opaq(lybctx, parent, first_p, parsed);
    } else if (snode->nodetype & LYS_LEAFLIST) {
        ret = lyb_parse_node_leaflist(lybctx, parent, snode, first_p, parsed);
    } else if (snode->nodetype == LYS_LIST) {
        ret = lyb_parse_node_list(lybctx, parent, snode, first_p, parsed);
    } else if (snode->nodetype & LYD_NODE_ANY) {
        ret = lyb_parse_node_any(lybctx, parent, snode, first_p, parsed);
    } else if (snode->nodetype & LYD_NODE_INNER) {
        ret = lyb_parse_node_inner(lybctx, parent, snode, first_p, parsed);
    } else {
        ret = lyb_parse_node_leaf(lybctx, parent, snode, first_p, parsed);
    }
    LY_CHECK_GOTO(ret, cleanup);

cleanup:
    free(mod_name);
    return ret;
}